

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot_sync_req.cxx
# Opt level: O0

bufptr __thiscall cornerstone::snapshot_sync_req::serialize(snapshot_sync_req *this)

{
  pointer pbVar1;
  buffer *this_00;
  buffer *this_01;
  size_t val;
  size_t p;
  type this_02;
  _Head_base<0UL,_cornerstone::buffer_*,_false> extraout_RDX;
  _Tuple_impl<1UL,_void_(*)(cornerstone::buffer_*)> in_RDI;
  bufptr bVar2;
  bufptr snp_buf;
  bufptr *buf;
  unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *in_stack_ffffffffffffff70;
  byte b;
  _Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false> this_03;
  buffer *buf_00;
  snapshot *in_stack_ffffffffffffffc8;
  buffer local_20 [32];
  
  this_03 = in_RDI.super__Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false>._M_head_impl;
  std::__shared_ptr_access<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
             )0x1e5676);
  buf_00 = local_20;
  snapshot::serialize(in_stack_ffffffffffffffc8);
  pbVar1 = std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::operator->
                     ((unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)0x1e5697);
  this_00 = (buffer *)buffer::size(pbVar1);
  this_01 = this_00 + 9;
  pbVar1 = std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::operator->
                     ((unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)0x1e56c2);
  val = buffer::size(pbVar1);
  pbVar1 = std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::operator->
                     ((unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)0x1e56df);
  p = buffer::pos(pbVar1);
  buffer::alloc((size_t)buf_00);
  std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::operator->
            ((unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)0x1e5719);
  std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::operator*
            (in_stack_ffffffffffffff70);
  buffer::put(this_00,buf_00);
  std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::operator->
            ((unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)0x1e574a);
  buffer::put((buffer *)this_03._M_head_impl,val);
  b = (byte)(val >> 0x38);
  std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::operator->
            ((unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)0x1e5767);
  buffer::put((buffer *)this_03._M_head_impl,b);
  std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::operator->
            ((unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)0x1e5787);
  this_02 = std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::operator*
                      (in_stack_ffffffffffffff70);
  buffer::put(this_00,buf_00);
  std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::operator->
            ((unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)0x1e57ba);
  buffer::pos(this_01,p);
  std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::~unique_ptr
            ((unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)this_02);
  bVar2._M_t.super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>._M_t.
  super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>.
  super__Head_base<0UL,_cornerstone::buffer_*,_false>._M_head_impl = extraout_RDX._M_head_impl;
  bVar2._M_t.super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>._M_t.
  super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>.
  super__Tuple_impl<1UL,_void_(*)(cornerstone::buffer_*)>.
  super__Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false>._M_head_impl =
       in_RDI.super__Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false>._M_head_impl;
  return (bufptr)bVar2._M_t.
                 super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>._M_t.
                 super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>;
}

Assistant:

bufptr snapshot_sync_req::serialize()
{
    bufptr snp_buf = snapshot_->serialize();
    bufptr buf = buffer::alloc(snp_buf->size() + sz_ulong + sz_byte + (data_->size() - data_->pos()));
    buf->put(*snp_buf);
    buf->put(offset_);
    buf->put(done_ ? (byte)1 : (byte)0);
    buf->put(*data_);
    buf->pos(0);
    return buf;
}